

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_integer_width_for_instruction(CompilerGLSL *this,Instruction *instr)

{
  Variant *pVVar1;
  uint32_t *puVar2;
  SPIRType *pSVar3;
  ulong uVar4;
  uint32_t uVar5;
  
  uVar5 = 0x20;
  if (2 < instr->length) {
    puVar2 = Compiler::stream(&this->super_Compiler,instr);
    if ((instr->op - 0xaa < 10) || (instr->op - 0x6f < 4)) {
      pSVar3 = Compiler::expression_type(&this->super_Compiler,puVar2[2]);
    }
    else {
      uVar4 = (ulong)*puVar2;
      if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
         && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
            pVVar1[uVar4].type == TypeType)) {
        pSVar3 = Variant::get<spirv_cross::SPIRType>(pVVar1 + uVar4);
      }
      else {
        pSVar3 = (SPIRType *)0x0;
      }
      if (pSVar3 == (SPIRType *)0x0) {
        return 0x20;
      }
      if (7 < *(int *)&(pSVar3->super_IVariant).field_0xc - 3U) {
        return 0x20;
      }
    }
    uVar5 = pSVar3->width;
  }
  return uVar5;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_instruction(const Instruction &instr) const
{
	if (instr.length < 3)
		return 32;

	auto *ops = stream(instr);

	switch (instr.op)
	{
	case OpSConvert:
	case OpConvertSToF:
	case OpUConvert:
	case OpConvertUToF:
	case OpIEqual:
	case OpINotEqual:
	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
		return expression_type(ops[2]).width;

	default:
	{
		// We can look at result type which is more robust.
		auto *type = maybe_get<SPIRType>(ops[0]);
		if (type && type_is_integral(*type))
			return type->width;
		else
			return 32;
	}
	}
}